

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O3

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::Point::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,Point *this,RefinementPattern *ref_pattern,dim_t codim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  runtime_error *prVar4;
  pointer *__ptr;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  DenseStorage<double,__1,__1,_1,_0> local_1a8;
  ostream local_198 [376];
  
  if (codim != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"Only codim = 0 allowed for a point",0x22);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"codim == 0","");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_208,&local_1e8,0x20,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"this code should not be reached");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ref_pattern[8] == (RefinementPattern)0x1) {
    iVar2 = (*(code *)**(undefined8 **)ref_pattern)(ref_pattern,0);
    if (iVar2 == 1) {
      plVar3 = (long *)operator_new(0x18);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_1a8,(DenseStorage<double,__1,__1,_1,_0> *)&this->coord_);
      *plVar3 = (long)&PTR_DimLocal_00492d38;
      plVar3[1] = (long)local_1a8.m_data;
      plVar3[2] = local_1a8.m_rows;
      local_208._M_dataplus._M_p = (pointer)plVar3;
      std::
      vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
      ::
      emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *
                 )&local_208);
      if ((long *)local_208._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_208._M_dataplus._M_p + 0x58))();
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"ref_pattern.NumChildren() = ",0x1c);
    (*(code *)**(undefined8 **)ref_pattern)(ref_pattern,0);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"ref_pattern.NumChildren(0) == 1","");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_208,&local_1e8,0x25,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"this code should not be reached");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"ref_patern.RefEl() = ",0x15);
  local_1e8._M_dataplus._M_p._0_1_ = ref_pattern[8];
  base::RefEl::ToString_abi_cxx11_(&local_208,(RefEl *)&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,local_208._M_dataplus._M_p,local_208._M_string_length);
  paVar1 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"ref_pattern.RefEl() == lf::base::RefEl::kPoint()","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_208,&local_1e8,0x23,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"this code should not be reached");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::unique_ptr<Geometry>> Point::ChildGeometry(
    const RefinementPattern& ref_pattern, lf::base::dim_t codim) const {
  LF_VERIFY_MSG(codim == 0, "Only codim = 0 allowed for a point");
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};
  LF_VERIFY_MSG(ref_pattern.RefEl() == lf::base::RefEl::kPoint(),
                "ref_patern.RefEl() = " << ref_pattern.RefEl().ToString());
  LF_VERIFY_MSG(ref_pattern.NumChildren(0) == 1,
                "ref_pattern.NumChildren() = " << ref_pattern.NumChildren(0));
  // The only way to "refine" a point is to copy it
  child_geo_uptrs.push_back(std::make_unique<Point>(coord_));
  return child_geo_uptrs;
}